

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall piksel::Graphics::_rect(Graphics *this,float a,float b,float c,float d)

{
  State *__x;
  State *state;
  float d_local;
  float c_local;
  float b_local;
  float a_local;
  Graphics *this_local;
  
  state._0_4_ = d;
  state._4_4_ = c;
  d_local = b;
  c_local = a;
  _b_local = this;
  push(this);
  __x = peek(this);
  switch((__x->shaderIrrelevantState).rectMode) {
  case CENTER:
    translate(this,c_local - state._4_4_ / 2.0,d_local - state._0_4_ / 2.0);
    scale(this,state._4_4_,state._0_4_);
    break;
  case CORNER:
    translate(this,c_local,d_local);
    scale(this,state._4_4_,state._0_4_);
    break;
  case CORNERS:
    if (state._4_4_ < c_local) {
      std::swap<float>(&c_local,(float *)((long)&state + 4));
    }
    if (state._0_4_ < d_local) {
      std::swap<float>(&d_local,(float *)&state);
    }
    translate(this,c_local,d_local);
    scale(this,state._4_4_ - c_local,state._0_4_ - d_local);
    break;
  case RADIUS:
    translate(this,c_local - state._4_4_,d_local - state._0_4_);
    scale(this,state._4_4_ * 2.0,state._0_4_ * 2.0);
  }
  std::vector<piksel::ShaderRelevantState,_std::allocator<piksel::ShaderRelevantState>_>::push_back
            (this->shaderRelevantStateVector,&__x->shaderRelevantState);
  pop(this);
  return;
}

Assistant:

void Graphics::_rect(float a, float b, float c, float d) {
    push();
    State& state = peek();
    switch(state.shaderIrrelevantState.rectMode) {
        case DrawMode::CENTER:
            translate(a - c / 2, b - d / 2);
            scale(c, d);
            break;
        case DrawMode::CORNER:
            translate(a, b);
            scale(c, d);
            break;
        case DrawMode::CORNERS:
            if (a > c) {
                std::swap(a, c);
            }
            if (b > d) {
                std::swap(b, d);
            }
            translate(a, b);
            scale(c - a, d - b);
            break;
        case DrawMode::RADIUS:
            translate(a - c, b - d);
            scale(c * 2, d * 2);
            break; 
    }
    shaderRelevantStateVector.push_back(state.shaderRelevantState);
    pop();
}